

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O3

void __thiscall QdfFixer::processLines(QdfFixer *this,string *input)

{
  pointer *ppbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  pointer pQVar3;
  pointer pcVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  int i;
  int iVar8;
  void *pvVar9;
  long lVar10;
  ostream *poVar11;
  size_type sVar12;
  pointer psVar13;
  ulong uVar14;
  long *plVar15;
  long lVar16;
  unsigned_long_long val;
  undefined8 *puVar17;
  ulong *puVar18;
  ulong uVar19;
  size_type *psVar20;
  size_t sVar21;
  char cVar22;
  iterator iVar23;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this_00;
  size_type __n;
  size_type sVar24;
  type ii;
  QPDFXRefEntry *e;
  char *pcVar25;
  pointer pQVar26;
  size_t sVar27;
  type ii_1;
  unsigned_long_long val_00;
  string new_length;
  smatch m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_138;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  ulong local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  undefined4 local_cc;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c8;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_a8;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_a0;
  char *local_98;
  ulong local_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  uint local_60;
  undefined4 uStack_5c;
  ulong local_58 [2];
  string *local_48;
  vector<long_long,_std::allocator<long_long>_> *local_40;
  pointer local_38;
  
  if ((processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_)
     , iVar8 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,"^(\\d+) 0 obj\n$",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_)
     , iVar8 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,
               "/Extends (\\d+ 0 R)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::
                                   re_ostream_obj_abi_cxx11_), iVar8 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,
               "^%% Object stream: object (\\d+)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_),
     iVar8 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,"^\\d+\n$",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_);
  }
  if ((processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_),
     iVar8 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,"^  /Size \\d+\n$",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_);
  }
  this->lineno = 0;
  local_118._M_len = 0;
  local_118._M_str = (char *)0x0;
  local_f8._M_current = (input->_M_dataplus)._M_p;
  local_c8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_begin._M_current = (char *)0x0;
  local_c8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)&this->ostream;
  local_40 = &this->ostream_offsets;
  local_a0 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)&this->ostream_discarded;
  local_48 = (string *)&this->ostream_extends;
  local_100 = 0;
  sVar24 = input->_M_string_length;
  pcVar25 = local_f8._M_current;
  do {
    uVar14 = local_100;
    this->lineno = this->lineno + 1;
    lVar16 = this->offset;
    this->last_offset = lVar16;
    if (sVar24 == 0) {
LAB_00112abf:
      local_cc = 0;
      uVar19 = sVar24;
      local_98 = pcVar25;
      local_90 = sVar24;
    }
    else {
      pvVar9 = memchr(pcVar25,10,sVar24);
      lVar10 = (long)pvVar9 - (long)pcVar25;
      if (lVar10 == -1 || pvVar9 == (void *)0x0) goto LAB_00112abf;
      uVar19 = lVar10 + 1;
      local_90 = sVar24 - uVar19;
      if (sVar24 < uVar19) {
        uVar19 = sVar24;
      }
      local_98 = pcVar25 + lVar10 + 1;
      local_cc = (undefined4)CONCAT71((int7)((ulong)local_98 >> 8),1);
    }
    local_f8._M_current = local_f8._M_current + uVar14;
    this->offset = uVar19 + lVar16;
    local_118._M_len = uVar19;
    local_118._M_str = pcVar25;
    local_100 = uVar19;
    switch(this->state) {
    case st_top:
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + uVar19),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,0);
      pcVar25 = local_118._M_str;
      uVar19 = local_118._M_len;
      if (bVar6) {
        lVar16 = (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar16 == 0) || (0xfffffffffffffffd < (lVar16 >> 3) * -0x5555555555555555 - 5U)) {
          psVar13 = (pointer)((long)local_c8.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x48);
        }
        else {
          psVar13 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        paVar2 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pointer)paVar2;
        if (psVar13->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_138,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_138._M_string_length = 0;
          local_138.field_2._M_allocated_capacity =
               local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        checkObjId(this,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        this->state = st_in_obj;
        uVar19 = local_118._M_len;
        pcVar25 = local_118._M_str;
      }
      else {
        if (local_118._M_len == 0) goto LAB_00113274;
        sVar21 = 5;
        if (local_118._M_len < 5) {
          sVar21 = local_118._M_len;
        }
        iVar8 = bcmp(local_118._M_str,"xref\n",sVar21);
        if ((uVar19 == 5) && (iVar8 == 0)) {
          this->xref_offset = this->last_offset;
          this->state = st_at_xref;
          uVar19 = 5;
        }
      }
      goto LAB_00113770;
    case st_in_obj:
      std::__ostream_insert<char,std::char_traits<char>>(this->out,pcVar25,uVar19);
      pcVar25 = local_118._M_str;
      sVar27 = local_118._M_len;
      sVar21 = 7;
      if (local_118._M_len < 7) {
        sVar21 = local_118._M_len;
      }
      if (local_118._M_len == 0) {
LAB_00113462:
        sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (&local_118,"/Type /ObjStm",0,0xd);
        if (sVar12 == 0xffffffffffffffff) {
          sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             (&local_118,"/Type /XRef",0,0xb);
          if (sVar12 != 0xffffffffffffffff) {
            uVar14 = QPDFXRefEntry::getOffset();
            this->xref_offset = uVar14;
            sVar27 = 0;
            if (uVar14 != 0) {
              do {
                sVar27 = sVar27 + 1;
                bVar6 = 0xff < uVar14;
                uVar14 = (long)uVar14 >> 8;
              } while (bVar6);
            }
            this->xref_f1_nbytes = sVar27;
            pQVar26 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pQVar3 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (pQVar26 == pQVar3) {
              sVar27 = this->xref_f2_nbytes;
              uVar7 = 1;
LAB_00113a92:
              do {
                sVar27 = sVar27 + 1;
                bVar6 = 0xff < uVar7;
                uVar7 = (int)uVar7 >> 8;
              } while (bVar6);
              this->xref_f2_nbytes = sVar27;
            }
            else {
              uVar7 = 1;
              do {
                iVar8 = QPDFXRefEntry::getType();
                if ((iVar8 == 2) && (iVar8 = QPDFXRefEntry::getObjStreamIndex(), (int)uVar7 < iVar8)
                   ) {
                  uVar7 = QPDFXRefEntry::getObjStreamIndex();
                }
                pQVar26 = pQVar26 + 0x18;
              } while (pQVar26 != pQVar3);
              sVar27 = this->xref_f2_nbytes;
              if (uVar7 != 0) goto LAB_00113a92;
            }
            poVar11 = this->out;
            this->xref_size =
                 ((long)(this->xref).
                        super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->xref).
                        super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  /Length ",10);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  /W [ 1 ",9);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ]\n",3);
            this->state = st_in_xref_stream_dict;
          }
        }
        else {
          this->state = st_in_ostream_dict;
          this->ostream_id = this->last_obj;
        }
      }
      else {
        iVar8 = bcmp(local_118._M_str,"stream\n",sVar21);
        if ((sVar27 == 7) && (iVar8 == 0)) {
          this->state = st_in_stream;
          this->stream_start = this->offset;
        }
        else {
          iVar8 = bcmp(pcVar25,"endobj\n",sVar21);
          if ((sVar27 != 7) || (iVar8 != 0)) goto LAB_00113462;
          this->state = st_top;
        }
      }
      break;
    case st_in_stream:
      if (uVar19 == 0) {
LAB_00113274:
        uVar19 = 0;
        pcVar25 = local_118._M_str;
      }
      else {
        sVar21 = 10;
        if (uVar19 < 10) {
          sVar21 = uVar19;
        }
        iVar8 = bcmp(pcVar25,"endstream\n",sVar21);
        if ((iVar8 == 0) && (uVar19 == 10)) {
          sVar27 = lVar16 - this->stream_start;
          uVar19 = 10;
          if ((long)sVar27 < 0) {
            QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar27);
            uVar19 = local_118._M_len;
            pcVar25 = local_118._M_str;
          }
          this->stream_length = sVar27;
          this->state = st_after_stream;
        }
      }
      goto LAB_00113770;
    case st_after_stream:
      if (uVar19 != 0) {
        sVar21 = 0x15;
        if (uVar19 < 0x15) {
          sVar21 = uVar19;
        }
        iVar8 = bcmp(pcVar25,"%QDF: ignore_newline\n",sVar21);
        if ((iVar8 == 0) && (uVar19 == 0x15)) {
          uVar19 = local_118._M_len;
          pcVar25 = local_118._M_str;
          if (this->stream_length != 0) {
            this->stream_length = this->stream_length - 1;
          }
          goto LAB_00113770;
        }
      }
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + uVar19),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,0);
      uVar19 = local_118._M_len;
      pcVar25 = local_118._M_str;
      if (bVar6) {
        lVar16 = (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar16 == 0) || (0xfffffffffffffffd < (lVar16 >> 3) * -0x5555555555555555 - 5U)) {
          psVar13 = (pointer)((long)local_c8.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x48);
        }
        else {
          psVar13 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        paVar2 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pointer)paVar2;
        if (psVar13->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_138,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_138._M_string_length = 0;
          local_138.field_2._M_allocated_capacity =
               local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        checkObjId(this,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        this->state = st_in_length;
        uVar19 = local_118._M_len;
        pcVar25 = local_118._M_str;
      }
LAB_00113770:
      std::__ostream_insert<char,std::char_traits<char>>(this->out,pcVar25,uVar19);
      break;
    case st_in_ostream_dict:
      if (uVar19 != 0) {
        sVar21 = 7;
        if (uVar19 < 7) {
          sVar21 = uVar19;
        }
        iVar8 = bcmp(pcVar25,"stream\n",sVar21);
        if ((iVar8 == 0) && (uVar19 == 7)) {
          this->state = st_in_ostream_offsets;
          break;
        }
      }
      iVar23._M_current =
           (this->ostream_discarded).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar23._M_current ==
          (this->ostream_discarded).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  (local_a0,iVar23,&local_118);
      }
      else {
        (iVar23._M_current)->_M_len = local_118._M_len;
        (iVar23._M_current)->_M_str = local_118._M_str;
        ppbVar1 = &(this->ostream_discarded).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + local_100),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,0);
      if (bVar6) {
        lVar16 = (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar16 == 0) || (0xfffffffffffffffd < (lVar16 >> 3) * -0x5555555555555555 - 5U)) {
          psVar13 = (pointer)((long)local_c8.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x48);
        }
        else {
          psVar13 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        paVar2 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pointer)paVar2;
        if (psVar13->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_138,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_138._M_string_length = 0;
          local_138.field_2._M_allocated_capacity =
               local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        std::__cxx11::string::operator=(local_48,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) goto LAB_001138b4;
      }
      break;
    case st_in_ostream_offsets:
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + uVar19),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,0);
      if (bVar6) {
        lVar16 = (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar16 == 0) || (0xfffffffffffffffd < (lVar16 >> 3) * -0x5555555555555555 - 5U)) {
          psVar13 = (pointer)((long)local_c8.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x48);
        }
        else {
          psVar13 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        paVar2 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pointer)paVar2;
        if (psVar13->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_138,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_138._M_string_length = 0;
          local_138.field_2._M_allocated_capacity =
               local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        checkObjId(this,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        iVar23._M_current =
             (this->ostream).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        this->stream_start = this->last_offset;
        this->state = st_in_ostream_outer;
        goto LAB_0011359f;
      }
      iVar23._M_current =
           (this->ostream_discarded).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = local_a0;
      if (iVar23._M_current !=
          (this->ostream_discarded).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        (iVar23._M_current)->_M_len = local_118._M_len;
        (iVar23._M_current)->_M_str = local_118._M_str;
        ppbVar1 = &(this->ostream_discarded).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
        break;
      }
LAB_0011371d:
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                (this_00,iVar23,&local_118);
      break;
    case st_in_ostream_outer:
      adjustOstreamXref(this);
      local_138._M_dataplus._M_p = (pointer)(this->last_offset - this->stream_start);
      __position._M_current =
           (this->ostream_offsets).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->ostream_offsets).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (local_40,__position,(longlong *)&local_138);
      }
      else {
        *__position._M_current = (longlong)local_138._M_dataplus._M_p;
        (this->ostream_offsets).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      this->state = st_in_ostream_obj;
      iVar23._M_current =
           (this->ostream).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0011359f:
      this_00 = local_a8;
      if (iVar23._M_current ==
          (this->ostream).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0011371d;
      (iVar23._M_current)->_M_len = local_118._M_len;
      (iVar23._M_current)->_M_str = local_118._M_str;
      ppbVar1 = &(this->ostream).
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
      break;
    case st_in_ostream_obj:
      iVar23._M_current =
           (this->ostream).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar23._M_current ==
          (this->ostream).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  (local_a8,iVar23,&local_118);
      }
      else {
        (iVar23._M_current)->_M_len = uVar19;
        (iVar23._M_current)->_M_str = pcVar25;
        ppbVar1 = &(this->ostream).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + local_100),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,0);
      sVar27 = local_118._M_len;
      if (bVar6) {
        lVar16 = (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar16 == 0) || (0xfffffffffffffffd < (lVar16 >> 3) * -0x5555555555555555 - 5U)) {
          psVar13 = (pointer)((long)local_c8.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x48);
        }
        else {
          psVar13 = local_c8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        paVar2 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pointer)paVar2;
        if (psVar13->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_138,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar13->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_138._M_string_length = 0;
          local_138.field_2._M_allocated_capacity =
               local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        checkObjId(this,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        this->state = st_in_ostream_outer;
      }
      else if (local_118._M_len != 0) {
        sVar21 = 10;
        if (local_118._M_len < 10) {
          sVar21 = local_118._M_len;
        }
        iVar8 = bcmp(local_118._M_str,"endstream\n",sVar21);
        if ((sVar27 == 10) && (iVar8 == 0)) {
          sVar27 = this->last_offset - this->stream_start;
          if ((long)sVar27 < 0) {
            QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar27);
          }
          this->stream_length = sVar27;
          writeOstream(this);
          this->state = st_in_obj;
        }
      }
      break;
    case st_in_xref_stream_dict:
      sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_118,"/Length",0,7)
      ;
      if ((sVar12 == 0xffffffffffffffff) &&
         (sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_118,"/W",0,2),
         sVar12 == 0xffffffffffffffff)) {
        sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_118,"/Size",0,5)
        ;
        if (sVar12 == 0xffffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->out,local_118._M_str,local_118._M_len);
        }
        else {
          poVar11 = this->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  /Size ",8);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        }
      }
      sVar27 = local_118._M_len;
      if (local_118._M_len != 0) {
        sVar21 = 7;
        if (local_118._M_len < 7) {
          sVar21 = local_118._M_len;
        }
        iVar8 = bcmp(local_118._M_str,"stream\n",sVar21);
        if ((sVar27 == 7) && (iVar8 == 0)) {
          writeBinary(this,0,1);
          writeBinary(this,0,this->xref_f1_nbytes);
          writeBinary(this,0,this->xref_f2_nbytes);
          pQVar26 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_38 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          if (pQVar26 != local_38) {
            do {
              uVar7 = QPDFXRefEntry::getType();
              if ((int)uVar7 < 0) {
                QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(uVar7);
LAB_00113998:
                iVar8 = QPDFXRefEntry::getObjStreamNumber();
                if (iVar8 < 0) {
                  QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar8);
                }
                i = QPDFXRefEntry::getObjStreamIndex();
                if (i < 0) {
                  QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(i);
                }
                val = (unsigned_long_long)iVar8;
                val_00 = (unsigned_long_long)i;
              }
              else {
                if (uVar7 != 1) goto LAB_00113998;
                val = QPDFXRefEntry::getOffset();
                if ((long)val < 0) {
                  QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(val);
                }
                val_00 = 0;
              }
              writeBinary(this,(ulong)uVar7,1);
              writeBinary(this,val,this->xref_f1_nbytes);
              writeBinary(this,val_00,this->xref_f2_nbytes);
              pQVar26 = pQVar26 + 0x18;
            } while (pQVar26 != local_38);
          }
          poVar11 = this->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nendstream\nendobj\n\n",0x13)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"startxref\n",10);
          poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n%%EOF\n",7);
LAB_00113a5d:
          this->state = st_done;
        }
      }
      break;
    case st_in_length:
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + uVar19),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,0);
      if (!bVar6) {
        pcVar4 = (this->filename)._M_dataplus._M_p;
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar4,pcVar4 + (this->filename)._M_string_length);
        std::__cxx11::string::append((char *)&local_88);
        uVar14 = this->lineno;
        cVar22 = '\x01';
        if (uVar14 < 10) goto LAB_00113e09;
        uVar19 = uVar14;
        cVar5 = '\x04';
        goto LAB_00113c00;
      }
      uVar14 = this->stream_length;
      cVar22 = '\x01';
      if (9 < uVar14) {
        uVar19 = uVar14;
        cVar5 = '\x04';
        do {
          cVar22 = cVar5;
          if (uVar19 < 100) {
            cVar22 = cVar22 + -2;
            goto LAB_001137bf;
          }
          if (uVar19 < 1000) {
            cVar22 = cVar22 + -1;
            goto LAB_001137bf;
          }
          if (uVar19 < 10000) goto LAB_001137bf;
          bVar6 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar5 = cVar22 + '\x04';
        } while (bVar6);
        cVar22 = cVar22 + '\x01';
      }
LAB_001137bf:
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,cVar22);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f0,(uint)local_e8,uVar14);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_f0);
      puVar18 = (ulong *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_138.field_2._M_allocated_capacity = *puVar18;
        local_138.field_2._8_8_ = plVar15[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *puVar18;
        local_138._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_138._M_string_length = plVar15[1];
      *plVar15 = (long)puVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      sVar27 = local_118._M_len;
      if ((long)local_118._M_len < 0) {
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(local_118._M_len);
      }
      sVar24 = local_138._M_string_length;
      lVar16 = this->offset - sVar27;
      this->offset = lVar16;
      if ((long)local_138._M_string_length < 0) {
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error
                  (local_138._M_string_length);
        lVar16 = this->offset;
      }
      this->offset = lVar16 + sVar24;
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,local_138._M_dataplus._M_p,local_138._M_string_length);
      this->state = st_top;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) break;
LAB_001138b4:
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      break;
    case st_at_xref:
      poVar11 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"0 ",2);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n0000000000 65535 f \n",0x15);
      pQVar3 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pQVar26 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start; pQVar26 != pQVar3;
          pQVar26 = pQVar26 + 0x18) {
        poVar11 = this->out;
        iVar8 = QPDFXRefEntry::getOffset();
        QUtil::int_to_string_abi_cxx11_((longlong)&local_138,iVar8);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," 00000 n \n",10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      this->state = st_before_trailer;
      break;
    case st_before_trailer:
      if (uVar19 != 0) {
        sVar21 = 0xb;
        if (uVar19 < 0xb) {
          sVar21 = uVar19;
        }
        iVar8 = bcmp(pcVar25,"trailer <<\n",sVar21);
        if ((iVar8 == 0) && (local_100 == 0xb)) {
          std::__ostream_insert<char,std::char_traits<char>>(this->out,pcVar25,0xb);
          this->state = st_in_trailer;
        }
      }
      break;
    case st_in_trailer:
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_f8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_f8._M_current + uVar19),&local_c8,
                         &processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,0);
      poVar11 = this->out;
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  /Size ",8);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,local_118._M_str,local_118._M_len);
      }
      sVar27 = local_118._M_len;
      if (local_118._M_len != 0) {
        sVar21 = 3;
        if (local_118._M_len < 3) {
          sVar21 = local_118._M_len;
        }
        iVar8 = bcmp(local_118._M_str,">>\n",sVar21);
        if ((sVar27 == 3) && (iVar8 == 0)) {
          poVar11 = this->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"startxref\n",10);
          poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n%%EOF\n",7);
          goto LAB_00113a5d;
        }
      }
    }
    sVar24 = local_90;
    pcVar25 = local_98;
    if ((char)local_cc == '\0') {
      if (local_c8.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
  while( true ) {
    if (uVar19 < 10000) goto LAB_00113e09;
    bVar6 = uVar19 < 100000;
    uVar19 = uVar19 / 10000;
    cVar5 = cVar22 + '\x04';
    if (bVar6) break;
LAB_00113c00:
    cVar22 = cVar5;
    if (uVar19 < 100) {
      cVar22 = cVar22 + -2;
      goto LAB_00113e09;
    }
    if (uVar19 < 1000) {
      cVar22 = cVar22 + -1;
      goto LAB_00113e09;
    }
  }
  cVar22 = cVar22 + '\x01';
LAB_00113e09:
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar22);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,uVar14);
  uVar14 = CONCAT44(uStack_5c,local_60) + local_80;
  uVar19 = 0xf;
  if (local_88 != local_78) {
    uVar19 = local_78[0];
  }
  if (uVar19 < uVar14) {
    uVar19 = 0xf;
    if (local_68 != local_58) {
      uVar19 = local_58[0];
    }
    if (uVar14 <= uVar19) {
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_00113eaf;
    }
  }
  puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_00113eaf:
  local_f0 = (long *)*puVar17;
  plVar15 = puVar17 + 2;
  if (local_f0 == plVar15) {
    local_e0 = *plVar15;
    uStack_d8 = puVar17[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar15;
  }
  local_e8 = puVar17[1];
  *puVar17 = plVar15;
  puVar17[1] = 0;
  *(undefined1 *)plVar15 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_138._M_dataplus._M_p = (pointer)*plVar15;
  psVar20 = (size_type *)(plVar15 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar20) {
    local_138.field_2._M_allocated_capacity = *psVar20;
    local_138.field_2._8_8_ = plVar15[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar20;
  }
  local_138._M_string_length = plVar15[1];
  *plVar15 = (long)psVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar11);
  exit(2);
}

Assistant:

void
QdfFixer::processLines(std::string const& input)
{
    using namespace std::literals;

    static const std::regex re_n_0_obj("^(\\d+) 0 obj\n$");
    static const std::regex re_extends("/Extends (\\d+ 0 R)");
    static const std::regex re_ostream_obj("^%% Object stream: object (\\d+)");
    static const std::regex re_num("^\\d+\n$");
    static const std::regex re_size_n("^  /Size \\d+\n$");

    auto sv_diff = [](size_t i) { return static_cast<std::string_view::difference_type>(i); };

    lineno = 0;
    bool more = true;
    auto len_line = sv_diff(0);

    std::string_view line;
    std::string_view input_view{input.data(), input.size()};
    size_t offs = 0;

    auto b_line = input.cbegin();
    std::smatch m;
    auto const matches = [&m, &b_line, &len_line](std::regex const& r) {
        return std::regex_search(b_line, b_line + len_line, m, r);
    };

    while (more) {
        ++lineno;
        last_offset = offset;
        b_line += len_line;

        offs = input_view.find('\n');
        if (offs == std::string::npos) {
            more = false;
            line = input_view;
        } else {
            offs++;
            line = input_view.substr(0, offs);
            input_view.remove_prefix(offs);
        }
        len_line = sv_diff(line.size());
        offset += len_line;

        if (state == st_top) {
            if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_obj;
            } else if (line.compare("xref\n"sv) == 0) {
                xref_offset = last_offset;
                state = st_at_xref;
            }
            out << line;
        } else if (state == st_in_obj) {
            out << line;
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_stream;
                stream_start = offset;
            } else if (line.compare("endobj\n"sv) == 0) {
                state = st_top;
            } else if (line.find("/Type /ObjStm"sv) != line.npos) {
                state = st_in_ostream_dict;
                ostream_id = last_obj;
            } else if (line.find("/Type /XRef"sv) != line.npos) {
                xref_offset = xref.back().getOffset();
                xref_f1_nbytes = 0;
                auto t = xref_offset;
                while (t) {
                    t >>= 8;
                    ++xref_f1_nbytes;
                }
                // Figure out how many bytes we need for ostream
                // index. Make sure we get at least 1 byte even if
                // there are no object streams.
                int max_objects = 1;
                for (auto const& e: xref) {
                    if ((e.getType() == 2) && (e.getObjStreamIndex() > max_objects)) {
                        max_objects = e.getObjStreamIndex();
                    }
                }
                while (max_objects) {
                    max_objects >>= 8;
                    ++xref_f2_nbytes;
                }
                auto esize = 1 + xref_f1_nbytes + xref_f2_nbytes;
                xref_size = 1 + xref.size();
                auto length = xref_size * esize;
                out << "  /Length " << length << "\n"
                    << "  /W [ 1 " << xref_f1_nbytes << " " << xref_f2_nbytes << " ]\n";
                state = st_in_xref_stream_dict;
            }
        } else if (state == st_in_ostream_dict) {
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_ostream_offsets;
            } else {
                ostream_discarded.push_back(line);
                if (matches(re_extends)) {
                    ostream_extends = m[1].str();
                }
            }
            // discard line
        } else if (state == st_in_ostream_offsets) {
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                stream_start = last_offset;
                state = st_in_ostream_outer;
                ostream.push_back(line);
            } else {
                ostream_discarded.push_back(line);
            }
            // discard line
        } else if (state == st_in_ostream_outer) {
            adjustOstreamXref();
            ostream_offsets.push_back(last_offset - stream_start);
            state = st_in_ostream_obj;
            ostream.push_back(line);
        } else if (state == st_in_ostream_obj) {
            ostream.push_back(line);
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                state = st_in_ostream_outer;
            } else if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                writeOstream();
                state = st_in_obj;
            }
        } else if (state == st_in_xref_stream_dict) {
            if ((line.find("/Length"sv) != line.npos) || (line.find("/W"sv) != line.npos)) {
                // already printed
            } else if (line.find("/Size"sv) != line.npos) {
                auto size = 1 + xref.size();
                out << "  /Size " << size << "\n";
            } else {
                out << line;
            }
            if (line.compare("stream\n"sv) == 0) {
                writeBinary(0, 1);
                writeBinary(0, xref_f1_nbytes);
                writeBinary(0, xref_f2_nbytes);
                for (auto const& x: xref) {
                    unsigned long long f1 = 0;
                    unsigned long long f2 = 0;
                    unsigned int type = QIntC::to_uint(x.getType());
                    if (1 == type) {
                        f1 = QIntC::to_ulonglong(x.getOffset());
                    } else {
                        f1 = QIntC::to_ulonglong(x.getObjStreamNumber());
                        f2 = QIntC::to_ulonglong(x.getObjStreamIndex());
                    }
                    writeBinary(type, 1);
                    writeBinary(f1, xref_f1_nbytes);
                    writeBinary(f2, xref_f2_nbytes);
                }
                out << "\nendstream\nendobj\n\n"
                    << "startxref\n"
                    << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_in_stream) {
            if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                state = st_after_stream;
            }
            out << line;
        } else if (state == st_after_stream) {
            if (line.compare("%QDF: ignore_newline\n"sv) == 0) {
                if (stream_length > 0) {
                    --stream_length;
                }
            } else if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_length;
            }
            out << line;
        } else if (state == st_in_length) {
            if (!matches(re_num)) {
                fatal(filename + ":" + std::to_string(lineno) + ": expected integer");
            }
            std::string new_length = std::to_string(stream_length) + "\n";
            offset -= QIntC::to_offset(line.length());
            offset += QIntC::to_offset(new_length.length());
            out << new_length;
            state = st_top;
        } else if (state == st_at_xref) {
            auto n = xref.size();
            out << "0 " << 1 + n << "\n0000000000 65535 f \n";
            for (auto const& e: xref) {
                out << QUtil::int_to_string(e.getOffset(), 10) << " 00000 n \n";
            }
            state = st_before_trailer;
        } else if (state == st_before_trailer) {
            if (line.compare("trailer <<\n"sv) == 0) {
                out << line;
                state = st_in_trailer;
            }
            // no output
        } else if (state == st_in_trailer) {
            if (matches(re_size_n)) {
                out << "  /Size " << 1 + xref.size() << "\n";
            } else {
                out << line;
            }
            if (line.compare(">>\n"sv) == 0) {
                out << "startxref\n" << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_done) {
            // ignore
        }
    }
}